

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorPool::FindAllExtensions
          (DescriptorPool *this,Descriptor *extendee,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *out)

{
  scoped_ptr<google::protobuf::DescriptorPool::Tables> *this_00;
  int iVar1;
  Tables *pTVar2;
  size_type sVar3;
  FieldDescriptor *pFVar4;
  int i;
  ulong uVar5;
  MutexLockMaybe lock;
  vector<int,_std::allocator<int>_> numbers;
  Descriptor *local_68;
  MutexLockMaybe local_60;
  _Vector_base<int,_std::allocator<int>_> local_58;
  undefined1 local_40 [24];
  
  local_68 = extendee;
  internal::MutexLockMaybe::MutexLockMaybe(&local_60,this->mutex_);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    this_00 = &this->tables_;
    pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
    sVar3 = std::tr1::
            _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
            ::count((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                     *)&pTVar2->extensions_loaded_from_db_,&local_68);
    if (sVar3 == 0) {
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar1 = (*this->fallback_database_->_vptr_DescriptorDatabase[5])
                        (this->fallback_database_,*(undefined8 *)(local_68 + 8));
      if ((char)iVar1 != '\0') {
        for (uVar5 = 0;
            uVar5 < (ulong)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_58._M_impl.super__Vector_impl_data._M_start >> 2);
            uVar5 = uVar5 + 1) {
          iVar1 = local_58._M_impl.super__Vector_impl_data._M_start[uVar5];
          pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                             (this_00);
          pFVar4 = Tables::FindExtension(pTVar2,local_68,iVar1);
          if (pFVar4 == (FieldDescriptor *)0x0) {
            TryFindExtensionInFallbackDatabase(this,local_68,iVar1);
          }
        }
        pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00)
        ;
        std::tr1::
        _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
        ::_M_insert(local_40,(_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                              *)&pTVar2->extensions_loaded_from_db_,&local_68);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
    }
  }
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  Tables::FindAllExtensions(pTVar2,local_68,out);
  if (this->underlay_ != (DescriptorPool *)0x0) {
    FindAllExtensions(this->underlay_,local_68,out);
  }
  internal::MutexLockMaybe::~MutexLockMaybe(&local_60);
  return;
}

Assistant:

void DescriptorPool::FindAllExtensions(
    const Descriptor* extendee, vector<const FieldDescriptor*>* out) const {
  MutexLockMaybe lock(mutex_);

  // Initialize tables_->extensions_ from the fallback database first
  // (but do this only once per descriptor).
  if (fallback_database_ != NULL &&
      tables_->extensions_loaded_from_db_.count(extendee) == 0) {
    vector<int> numbers;
    if (fallback_database_->FindAllExtensionNumbers(extendee->full_name(),
                                                    &numbers)) {
      for (int i = 0; i < numbers.size(); ++i) {
        int number = numbers[i];
        if (tables_->FindExtension(extendee, number) == NULL) {
          TryFindExtensionInFallbackDatabase(extendee, number);
        }
      }
      tables_->extensions_loaded_from_db_.insert(extendee);
    }
  }

  tables_->FindAllExtensions(extendee, out);
  if (underlay_ != NULL) {
    underlay_->FindAllExtensions(extendee, out);
  }
}